

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.hpp
# Opt level: O3

basic_endpoint<boost::asio::ip::tcp> * __thiscall
libtorrent::aux::
read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
          (basic_endpoint<boost::asio::ip::tcp> *__return_storage_ptr__,aux *this,char **in)

{
  byte bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  uint uVar7;
  uint uVar8;
  address addr;
  address local_28;
  
  uVar7 = 0;
  iVar4 = 4;
  puVar6 = (undefined1 *)(*(long *)this + 1);
  do {
    puVar5 = puVar6;
    uVar8 = uVar7 << 8;
    bVar1 = puVar5[-1];
    uVar7 = bVar1 | uVar8;
    *(undefined1 **)this = puVar5;
    puVar6 = puVar5 + 1;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  local_28.ipv4_address_.addr_.s_addr =
       (in4_addr_type)
       (uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | (uint)bVar1 << 0x18);
  local_28.type_ = ipv4;
  local_28.ipv6_address_.addr_.__in6_u._0_8_ = 0;
  local_28.ipv6_address_.addr_.__in6_u._8_8_ = 0;
  local_28.ipv6_address_.scope_id_ = 0;
  uVar2 = *puVar5;
  *(undefined1 **)this = puVar6;
  uVar3 = *puVar6;
  *(undefined1 **)this = puVar5 + 2;
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            (__return_storage_ptr__,&local_28,CONCAT11(uVar2,uVar3));
  return __return_storage_ptr__;
}

Assistant:

Endpoint read_v4_endpoint(InIt&& in)
	{
		address addr = read_v4_address(in);
		std::uint16_t port = read_uint16(in);
		return Endpoint(addr, port);
	}